

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

char * jx9MemObjTypeDump(jx9_value *pVal)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = pVal->iFlags;
  if ((uVar1 & 0x20) != 0) {
    return "null";
  }
  if ((uVar1 & 2) != 0) {
    return "int";
  }
  if ((uVar1 & 4) != 0) {
    return "float";
  }
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 8) != 0) {
      return "bool";
    }
    if ((uVar1 & 0x40) == 0) {
      pcVar2 = "resource";
      if ((uVar1 >> 8 & 1) == 0) {
        pcVar2 = "";
      }
      return pcVar2;
    }
    pcVar2 = "JSON Object";
    if ((*(byte *)((pVal->x).iVal + 0x40) & 1) == 0) {
      pcVar2 = "JSON Array";
    }
    return pcVar2;
  }
  return "string";
}

Assistant:

JX9_PRIVATE const char * jx9MemObjTypeDump(jx9_value *pVal)
{
	const char *zType = "";
	if( pVal->iFlags & MEMOBJ_NULL ){
		zType = "null";
	}else if( pVal->iFlags & MEMOBJ_INT ){
		zType = "int";
	}else if( pVal->iFlags & MEMOBJ_REAL ){
		zType = "float";
	}else if( pVal->iFlags & MEMOBJ_STRING ){
		zType = "string";
	}else if( pVal->iFlags & MEMOBJ_BOOL ){
		zType = "bool";
	}else if( pVal->iFlags & MEMOBJ_HASHMAP ){
		jx9_hashmap *pMap = (jx9_hashmap *)pVal->x.pOther;
		if( pMap->iFlags & HASHMAP_JSON_OBJECT ){
			zType = "JSON Object";
		}else{
			zType = "JSON Array";
		}
	}else if( pVal->iFlags & MEMOBJ_RES ){
		zType = "resource";
	}
	return zType;
}